

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

void cdef_filter_16_0_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  undefined2 uVar2;
  int iVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  long lVar49;
  long lVar50;
  uint uVar51;
  long lVar52;
  bool bVar53;
  undefined2 uVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined8 uVar128;
  undefined8 uVar129;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  short sStack_194;
  undefined1 local_d8 [32];
  
  bVar53 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar49 = (long)dir;
  lVar40 = (long)cdef_directions_padded[lVar49 + 2][0];
  lVar44 = (long)cdef_directions_padded[lVar49 + 2][1];
  lVar45 = (long)cdef_directions_padded[lVar49 + 4][0];
  lVar46 = (long)cdef_directions_padded[lVar49 + 4][1];
  lVar41 = (long)cdef_directions_padded[lVar49][0];
  lVar49 = (long)cdef_directions_padded[lVar49][1];
  local_d8._2_2_ = (undefined2)pri_strength;
  uVar54 = (undefined2)sec_strength;
  sStack_194 = (short)(dstride >> 0x1f);
  if (block_width == 8) {
    uVar48 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar48 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar48 = 0;
      }
    }
    uVar51 = sec_damping;
    if (sec_strength != 0) {
      iVar3 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar51 = sec_damping - iVar3;
      if (sec_damping < iVar3) {
        uVar51 = 0;
      }
    }
    if (0 < block_height) {
      local_d8._0_2_ = local_d8._2_2_;
      local_d8._4_2_ = local_d8._2_2_;
      local_d8._6_2_ = local_d8._2_2_;
      local_d8._8_2_ = local_d8._2_2_;
      local_d8._10_2_ = local_d8._2_2_;
      local_d8._12_2_ = local_d8._2_2_;
      local_d8._14_2_ = local_d8._2_2_;
      local_d8._16_2_ = local_d8._2_2_;
      local_d8._18_2_ = local_d8._2_2_;
      local_d8._20_2_ = local_d8._2_2_;
      local_d8._22_2_ = local_d8._2_2_;
      local_d8._24_2_ = local_d8._2_2_;
      local_d8._26_2_ = local_d8._2_2_;
      local_d8._28_2_ = local_d8._2_2_;
      local_d8._30_2_ = local_d8._2_2_;
      uVar1 = (undefined2)cdef_pri_taps[bVar53][0];
      uVar2 = (undefined2)cdef_pri_taps[bVar53][1];
      auVar97._2_2_ = uVar54;
      auVar97._0_2_ = uVar54;
      auVar97._4_2_ = uVar54;
      auVar97._6_2_ = uVar54;
      auVar97._8_2_ = uVar54;
      auVar97._10_2_ = uVar54;
      auVar97._12_2_ = uVar54;
      auVar97._14_2_ = uVar54;
      auVar97._16_2_ = uVar54;
      auVar97._18_2_ = uVar54;
      auVar97._20_2_ = uVar54;
      auVar97._22_2_ = uVar54;
      auVar97._24_2_ = uVar54;
      auVar97._26_2_ = uVar54;
      auVar97._28_2_ = uVar54;
      auVar97._30_2_ = uVar54;
      uVar43 = 0;
      auVar115._8_2_ = 0xbfff;
      auVar115._0_8_ = 0xbfffbfffbfffbfff;
      auVar115._10_2_ = 0xbfff;
      auVar115._12_2_ = 0xbfff;
      auVar115._14_2_ = 0xbfff;
      auVar115._16_2_ = 0xbfff;
      auVar115._18_2_ = 0xbfff;
      auVar115._20_2_ = 0xbfff;
      auVar115._22_2_ = 0xbfff;
      auVar115._24_2_ = 0xbfff;
      auVar115._26_2_ = 0xbfff;
      auVar115._28_2_ = 0xbfff;
      auVar115._30_2_ = 0xbfff;
      do {
        auVar126 = ZEXT116(0) * *(undefined1 (*) [16])in +
                   ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
        auVar55 = ZEXT116(1) * *(undefined1 (*) [16])in;
        uVar128 = auVar55._0_8_;
        uVar129 = auVar55._8_8_;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar40 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar40 * 2));
        auVar103._16_16_ = auVar55;
        auVar103._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar40 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar40 * -2 + 0x120));
        auVar61._16_16_ = auVar55;
        auVar61._0_16_ = auVar56;
        auVar5._16_8_ = uVar128;
        auVar5._0_16_ = auVar126;
        auVar5._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar103,auVar5);
        auVar93 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar57 = ZEXT416(uVar48);
        auVar77 = vpsrlw_avx2(auVar62,auVar57);
        auVar77 = vpsubusw_avx2(local_d8,auVar77);
        auVar62 = vpminsw_avx2(auVar62,auVar77);
        auVar77 = vpaddw_avx2(auVar62,auVar93);
        auVar6._16_8_ = uVar128;
        auVar6._0_16_ = auVar126;
        auVar6._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar61,auVar6);
        auVar112 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar4 = vpsrlw_avx2(auVar62,auVar57);
        auVar4 = vpsubusw_avx2(local_d8,auVar4);
        auVar62 = vpminsw_avx2(auVar4,auVar62);
        auVar62 = vpaddw_avx2(auVar62,auVar112);
        auVar62 = vpaddw_avx2(auVar62 ^ auVar112,auVar77 ^ auVar93);
        auVar35._2_2_ = uVar1;
        auVar35._0_2_ = uVar1;
        auVar35._4_2_ = uVar1;
        auVar35._6_2_ = uVar1;
        auVar35._8_2_ = uVar1;
        auVar35._10_2_ = uVar1;
        auVar35._12_2_ = uVar1;
        auVar35._14_2_ = uVar1;
        auVar35._16_2_ = uVar1;
        auVar35._18_2_ = uVar1;
        auVar35._20_2_ = uVar1;
        auVar35._22_2_ = uVar1;
        auVar35._24_2_ = uVar1;
        auVar35._26_2_ = uVar1;
        auVar35._28_2_ = uVar1;
        auVar35._30_2_ = uVar1;
        auVar4 = vpmullw_avx2(auVar62,auVar35);
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar44 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar44 * 2));
        auVar113._16_16_ = auVar55;
        auVar113._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar44 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar44 * -2 + 0x120));
        auVar121._16_16_ = auVar55;
        auVar121._0_16_ = auVar56;
        auVar7._16_8_ = uVar128;
        auVar7._0_16_ = auVar126;
        auVar7._24_8_ = uVar129;
        auVar93 = vpsubw_avx2(auVar113,auVar7);
        auVar62 = vpabsw_avx2(auVar93);
        auVar77 = vpsrlw_avx2(auVar62,auVar57);
        auVar112 = vpsraw_avx2(auVar93,0xf);
        auVar77 = vpsubusw_avx2(local_d8,auVar77);
        auVar62 = vpminsw_avx2(auVar62,auVar77);
        auVar77 = vpaddw_avx2(auVar62,auVar112);
        auVar8._16_8_ = uVar128;
        auVar8._0_16_ = auVar126;
        auVar8._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar121,auVar8);
        auVar137 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar93 = vpsrlw_avx2(auVar62,auVar57);
        auVar93 = vpsubusw_avx2(local_d8,auVar93);
        auVar62 = vpminsw_avx2(auVar62,auVar93);
        auVar62 = vpaddw_avx2(auVar62,auVar137);
        auVar62 = vpaddw_avx2(auVar62 ^ auVar137,auVar77 ^ auVar112);
        auVar33._2_2_ = uVar2;
        auVar33._0_2_ = uVar2;
        auVar33._4_2_ = uVar2;
        auVar33._6_2_ = uVar2;
        auVar33._8_2_ = uVar2;
        auVar33._10_2_ = uVar2;
        auVar33._12_2_ = uVar2;
        auVar33._14_2_ = uVar2;
        auVar33._16_2_ = uVar2;
        auVar33._18_2_ = uVar2;
        auVar33._20_2_ = uVar2;
        auVar33._22_2_ = uVar2;
        auVar33._24_2_ = uVar2;
        auVar33._26_2_ = uVar2;
        auVar33._28_2_ = uVar2;
        auVar33._30_2_ = uVar2;
        auVar62 = vpmullw_avx2(auVar62,auVar33);
        auVar77 = vpaddw_avx2(auVar62,auVar4);
        auVar62 = vpand_avx2(auVar115,auVar103);
        auVar4 = vpand_avx2(auVar115,auVar61);
        auVar4 = vpmaxsw_avx2(auVar4,auVar62);
        auVar62 = vpand_avx2(auVar115,auVar113);
        auVar4 = vpmaxsw_avx2(auVar62,auVar4);
        auVar62 = vpand_avx2(auVar121,auVar115);
        auVar112 = vpmaxsw_avx2(auVar62,auVar4);
        auVar62 = vpminsw_avx2(auVar103,auVar61);
        auVar62 = vpminsw_avx2(auVar62,auVar113);
        auVar137 = vpminsw_avx2(auVar121,auVar62);
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar45 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar45 * 2));
        auVar76._16_16_ = auVar55;
        auVar76._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar45 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar45 * -2 + 0x120));
        auVar138._16_16_ = auVar55;
        auVar138._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar41 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar41 * 2));
        auVar142._16_16_ = auVar55;
        auVar142._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar41 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar41 * -2 + 0x120));
        auVar143._16_16_ = auVar55;
        auVar143._0_16_ = auVar56;
        auVar9._16_8_ = uVar128;
        auVar9._0_16_ = auVar126;
        auVar9._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar76,auVar9);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar4 = vpsrlw_avx2(auVar62,ZEXT416(uVar51));
        auVar4 = vpsubusw_avx2(auVar97,auVar4);
        auVar62 = vpminsw_avx2(auVar62,auVar4);
        auVar4 = vpaddw_avx2(auVar62,auVar104);
        auVar10._16_8_ = uVar128;
        auVar10._0_16_ = auVar126;
        auVar10._24_8_ = uVar129;
        auVar105 = vpsubw_avx2(auVar138,auVar10);
        auVar62 = vpabsw_avx2(auVar105);
        auVar93 = vpsrlw_avx2(auVar62,ZEXT416(uVar51));
        auVar105 = vpsraw_avx2(auVar105,0xf);
        auVar93 = vpsubusw_avx2(auVar97,auVar93);
        auVar62 = vpminsw_avx2(auVar93,auVar62);
        auVar62 = vpaddw_avx2(auVar62,auVar105);
        auVar4 = vpaddw_avx2(auVar62 ^ auVar105,auVar4 ^ auVar104);
        auVar11._16_8_ = uVar128;
        auVar11._0_16_ = auVar126;
        auVar11._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar142,auVar11);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar57 = ZEXT416(uVar51);
        auVar93 = vpsrlw_avx2(auVar62,auVar57);
        auVar93 = vpsubusw_avx2(auVar97,auVar93);
        auVar62 = vpminsw_avx2(auVar93,auVar62);
        auVar93 = vpaddw_avx2(auVar62,auVar104);
        auVar12._16_8_ = uVar128;
        auVar12._0_16_ = auVar126;
        auVar12._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar143,auVar12);
        auVar122 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar105 = vpsrlw_avx2(auVar62,auVar57);
        auVar105 = vpsubusw_avx2(auVar97,auVar105);
        auVar62 = vpminsw_avx2(auVar105,auVar62);
        auVar62 = vpaddw_avx2(auVar122,auVar62);
        auVar62 = vpaddw_avx2(auVar93 ^ auVar104,auVar122 ^ auVar62);
        auVar62 = vpaddw_avx2(auVar4,auVar62);
        auVar31._8_2_ = 2;
        auVar31._0_8_ = 0x2000200020002;
        auVar31._10_2_ = 2;
        auVar31._12_2_ = 2;
        auVar31._14_2_ = 2;
        auVar31._16_2_ = 2;
        auVar31._18_2_ = 2;
        auVar31._20_2_ = 2;
        auVar31._22_2_ = 2;
        auVar31._24_2_ = 2;
        auVar31._26_2_ = 2;
        auVar31._28_2_ = 2;
        auVar31._30_2_ = 2;
        auVar62 = vpmullw_avx2(auVar62,auVar31);
        auVar77 = vpaddw_avx2(auVar77,auVar62);
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar46 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar46 * 2));
        auVar94._16_16_ = auVar55;
        auVar94._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar46 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar46 * -2 + 0x120));
        auVar106._16_16_ = auVar55;
        auVar106._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar49 * 2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])
                              (*(undefined1 (*) [16])((long)in + 0x120) + lVar49 * 2));
        auVar114._16_16_ = auVar55;
        auVar114._0_16_ = auVar56;
        auVar55 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar49 * -2));
        auVar56 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar49 * -2 + 0x120));
        auVar123._16_16_ = auVar55;
        auVar123._0_16_ = auVar56;
        auVar13._16_8_ = uVar128;
        auVar13._0_16_ = auVar126;
        auVar13._24_8_ = uVar129;
        auVar93 = vpsubw_avx2(auVar94,auVar13);
        auVar62 = vpabsw_avx2(auVar93);
        auVar4 = vpsrlw_avx2(auVar62,auVar57);
        auVar105 = vpsraw_avx2(auVar93,0xf);
        auVar4 = vpsubusw_avx2(auVar97,auVar4);
        auVar62 = vpminsw_avx2(auVar62,auVar4);
        auVar4 = vpaddw_avx2(auVar105,auVar62);
        auVar14._16_8_ = uVar128;
        auVar14._0_16_ = auVar126;
        auVar14._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar106,auVar14);
        auVar104 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar93 = vpsrlw_avx2(auVar62,auVar57);
        auVar93 = vpsubusw_avx2(auVar97,auVar93);
        auVar62 = vpminsw_avx2(auVar62,auVar93);
        auVar62 = vpaddw_avx2(auVar104,auVar62);
        auVar4 = vpaddw_avx2(auVar104 ^ auVar62,auVar105 ^ auVar4);
        auVar15._16_8_ = uVar128;
        auVar15._0_16_ = auVar126;
        auVar15._24_8_ = uVar129;
        auVar62 = vpsubw_avx2(auVar114,auVar15);
        auVar122 = vpsraw_avx2(auVar62,0xf);
        auVar62 = vpabsw_avx2(auVar62);
        auVar93 = vpsrlw_avx2(auVar62,ZEXT416(uVar51));
        auVar93 = vpsubusw_avx2(auVar97,auVar93);
        auVar62 = vpminsw_avx2(auVar93,auVar62);
        auVar93 = vpaddw_avx2(auVar62,auVar122);
        auVar16._16_8_ = uVar128;
        auVar16._0_16_ = auVar126;
        auVar16._24_8_ = uVar129;
        auVar104 = vpsubw_avx2(auVar123,auVar16);
        auVar62 = vpabsw_avx2(auVar104);
        auVar105 = vpsrlw_avx2(auVar62,ZEXT416(uVar51));
        auVar105 = vpsubusw_avx2(auVar97,auVar105);
        auVar62 = vpminsw_avx2(auVar62,auVar105);
        auVar105 = vpsraw_avx2(auVar104,0xf);
        auVar62 = vpaddw_avx2(auVar62,auVar105);
        auVar62 = vpaddw_avx2(auVar93 ^ auVar122,auVar62 ^ auVar105);
        auVar62 = vpaddw_avx2(auVar4,auVar62);
        auVar29._8_2_ = 1;
        auVar29._0_8_ = 0x1000100010001;
        auVar29._10_2_ = 1;
        auVar29._12_2_ = 1;
        auVar29._14_2_ = 1;
        auVar29._16_2_ = 1;
        auVar29._18_2_ = 1;
        auVar29._20_2_ = 1;
        auVar29._22_2_ = 1;
        auVar29._24_2_ = 1;
        auVar29._26_2_ = 1;
        auVar29._28_2_ = 1;
        auVar29._30_2_ = 1;
        auVar62 = vpmullw_avx2(auVar62,auVar29);
        auVar62 = vpaddw_avx2(auVar62,auVar77);
        auVar77 = vpand_avx2(auVar76,auVar115);
        auVar4 = vpmaxsw_avx2(auVar77,auVar112);
        auVar77 = vpand_avx2(auVar138,auVar115);
        auVar4 = vpmaxsw_avx2(auVar4,auVar77);
        auVar77 = vpand_avx2(auVar142,auVar115);
        auVar93 = vpmaxsw_avx2(auVar4,auVar77);
        auVar77 = vpand_avx2(auVar143,auVar115);
        auVar4 = vpand_avx2(auVar115,auVar94);
        auVar4 = vpmaxsw_avx2(auVar4,auVar77);
        auVar77 = vpand_avx2(auVar115,auVar106);
        auVar4 = vpmaxsw_avx2(auVar77,auVar4);
        auVar77 = vpand_avx2(auVar115,auVar114);
        auVar4 = vpmaxsw_avx2(auVar77,auVar4);
        auVar77 = vpand_avx2(auVar123,auVar115);
        auVar77 = vpmaxsw_avx2(auVar77,auVar4);
        auVar17._16_8_ = uVar128;
        auVar17._0_16_ = auVar126;
        auVar17._24_8_ = uVar129;
        auVar4 = vpmaxsw_avx2(auVar17,auVar93);
        auVar77 = vpmaxsw_avx2(auVar4,auVar77);
        auVar4 = vpminsw_avx2(auVar76,auVar137);
        auVar4 = vpminsw_avx2(auVar138,auVar4);
        auVar4 = vpminsw_avx2(auVar142,auVar4);
        auVar4 = vpminsw_avx2(auVar143,auVar4);
        auVar93 = vpminsw_avx2(auVar94,auVar106);
        auVar93 = vpminsw_avx2(auVar93,auVar114);
        auVar93 = vpminsw_avx2(auVar123,auVar93);
        auVar18._16_8_ = uVar128;
        auVar18._0_16_ = auVar126;
        auVar18._24_8_ = uVar129;
        auVar4 = vpminsw_avx2(auVar18,auVar4);
        auVar4 = vpminsw_avx2(auVar4,auVar93);
        auVar93 = vpsraw_avx2(auVar62,0xf);
        auVar26._8_2_ = 8;
        auVar26._0_8_ = 0x8000800080008;
        auVar26._10_2_ = 8;
        auVar26._12_2_ = 8;
        auVar26._14_2_ = 8;
        auVar26._16_2_ = 8;
        auVar26._18_2_ = 8;
        auVar26._20_2_ = 8;
        auVar26._22_2_ = 8;
        auVar26._24_2_ = 8;
        auVar26._26_2_ = 8;
        auVar26._28_2_ = 8;
        auVar26._30_2_ = 8;
        auVar62 = vpaddw_avx2(auVar62,auVar26);
        auVar62 = vpaddw_avx2(auVar62,auVar93);
        auVar62 = vpsraw_avx2(auVar62,4);
        auVar19._16_8_ = uVar128;
        auVar19._0_16_ = auVar126;
        auVar19._24_8_ = uVar129;
        auVar62 = vpaddw_avx2(auVar19,auVar62);
        auVar62 = vpmaxsw_avx2(auVar62,auVar4);
        auVar62 = vpminsw_avx2(auVar62,auVar77);
        *(undefined1 (*) [16])dest = auVar62._16_16_;
        *(undefined1 (*) [16])
         ((long)*(undefined1 (*) [16])dest + CONCAT26(sStack_194,(int6)dstride) * 2) =
             auVar62._0_16_;
        uVar43 = uVar43 + 2;
        in = (uint16_t *)((long)in + 0x240);
        dest = (void *)((long)*(undefined1 (*) [16])dest + (long)dstride * 4);
      } while (uVar43 < (uint)block_height);
    }
  }
  else {
    uVar48 = pri_damping;
    if (pri_strength != 0) {
      iVar3 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar48 = pri_damping - iVar3;
      if (pri_damping < iVar3) {
        uVar48 = 0;
      }
    }
    uVar51 = sec_damping;
    if (sec_strength != 0) {
      iVar3 = 0x1f;
      if (sec_strength != 0) {
        for (; (uint)sec_strength >> iVar3 == 0; iVar3 = iVar3 + -1) {
        }
      }
      uVar51 = sec_damping - iVar3;
      if (sec_damping < iVar3) {
        uVar51 = 0;
      }
    }
    if (0 < block_height) {
      uVar1 = (undefined2)cdef_pri_taps[bVar53][0];
      uVar2 = (undefined2)cdef_pri_taps[bVar53][1];
      auVar55 = ZEXT416(uVar51);
      lVar38 = lVar49 * -2;
      lVar52 = lVar46 * -2;
      lVar47 = lVar41 * -2;
      lVar50 = lVar45 * -2;
      lVar42 = lVar44 * -2;
      lVar39 = lVar40 * -2;
      uVar43 = 0;
      auVar62._8_2_ = 0xbfff;
      auVar62._0_8_ = 0xbfffbfffbfffbfff;
      auVar62._10_2_ = 0xbfff;
      auVar62._12_2_ = 0xbfff;
      auVar62._14_2_ = 0xbfff;
      auVar62._16_2_ = 0xbfff;
      auVar62._18_2_ = 0xbfff;
      auVar62._20_2_ = 0xbfff;
      auVar62._22_2_ = 0xbfff;
      auVar62._24_2_ = 0xbfff;
      auVar62._26_2_ = 0xbfff;
      auVar62._28_2_ = 0xbfff;
      auVar62._30_2_ = 0xbfff;
      do {
        auVar56._8_8_ = 0;
        auVar56._0_8_ = *(ulong *)in;
        auVar127._8_8_ = 0;
        auVar127._0_8_ = *(ulong *)((long)in + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar127,auVar56);
        auVar66._8_8_ = 0;
        auVar66._0_8_ = *(ulong *)((long)in + 0x240);
        auVar78._8_8_ = 0;
        auVar78._0_8_ = *(ulong *)((long)in + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar78,auVar66);
        auVar127 = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar56 = ZEXT116(1) * auVar56;
        uVar128 = auVar56._0_8_;
        uVar129 = auVar56._8_8_;
        auVar57._8_8_ = 0;
        auVar57._0_8_ = *(ulong *)((long)in + lVar40 * 2);
        auVar67._8_8_ = 0;
        auVar67._0_8_ = *(ulong *)((long)in + lVar40 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar67,auVar57);
        auVar68._8_8_ = 0;
        auVar68._0_8_ = *(ulong *)((long)in + lVar40 * 2 + 0x240);
        auVar79._8_8_ = 0;
        auVar79._0_8_ = *(ulong *)((long)in + lVar40 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar79,auVar68);
        auVar85._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar85._16_16_ = ZEXT116(1) * auVar56;
        auVar77._16_8_ = uVar128;
        auVar77._0_16_ = auVar127;
        auVar77._24_8_ = uVar129;
        auVar93 = vpsubw_avx2(auVar85,auVar77);
        auVar77 = vpabsw_avx2(auVar93);
        auVar126 = ZEXT416(uVar48);
        auVar4 = vpsrlw_avx2(auVar77,auVar126);
        auVar137 = vpsraw_avx2(auVar93,0xf);
        auVar36._2_2_ = local_d8._2_2_;
        auVar36._0_2_ = local_d8._2_2_;
        auVar36._4_2_ = local_d8._2_2_;
        auVar36._6_2_ = local_d8._2_2_;
        auVar36._8_2_ = local_d8._2_2_;
        auVar36._10_2_ = local_d8._2_2_;
        auVar36._12_2_ = local_d8._2_2_;
        auVar36._14_2_ = local_d8._2_2_;
        auVar36._16_2_ = local_d8._2_2_;
        auVar36._18_2_ = local_d8._2_2_;
        auVar36._20_2_ = local_d8._2_2_;
        auVar36._22_2_ = local_d8._2_2_;
        auVar36._24_2_ = local_d8._2_2_;
        auVar36._26_2_ = local_d8._2_2_;
        auVar36._28_2_ = local_d8._2_2_;
        auVar36._30_2_ = local_d8._2_2_;
        auVar4 = vpsubusw_avx2(auVar36,auVar4);
        auVar77 = vpminsw_avx2(auVar77,auVar4);
        auVar4 = vpaddw_avx2(auVar77,auVar137);
        auVar58._8_8_ = 0;
        auVar58._0_8_ = *(ulong *)((long)in + lVar39);
        auVar87._8_8_ = 0;
        auVar87._0_8_ = *(ulong *)((long)in + lVar39 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar87,auVar58);
        auVar88._8_8_ = 0;
        auVar88._0_8_ = *(ulong *)((long)in + lVar39 + 0x240);
        auVar99._8_8_ = 0;
        auVar99._0_8_ = *(ulong *)((long)in + lVar39 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar99,auVar88);
        auVar63._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar63._16_16_ = ZEXT116(1) * auVar56;
        auVar93._16_8_ = uVar128;
        auVar93._0_16_ = auVar127;
        auVar93._24_8_ = uVar129;
        auVar112 = vpsubw_avx2(auVar63,auVar93);
        auVar77 = vpabsw_avx2(auVar112);
        auVar93 = vpsrlw_avx2(auVar77,auVar126);
        auVar112 = vpsraw_avx2(auVar112,0xf);
        auVar93 = vpsubusw_avx2(auVar36,auVar93);
        auVar77 = vpminsw_avx2(auVar77,auVar93);
        auVar77 = vpaddw_avx2(auVar77,auVar112);
        auVar77 = vpaddw_avx2(auVar77 ^ auVar112,auVar4 ^ auVar137);
        auVar34._2_2_ = uVar1;
        auVar34._0_2_ = uVar1;
        auVar34._4_2_ = uVar1;
        auVar34._6_2_ = uVar1;
        auVar34._8_2_ = uVar1;
        auVar34._10_2_ = uVar1;
        auVar34._12_2_ = uVar1;
        auVar34._14_2_ = uVar1;
        auVar34._16_2_ = uVar1;
        auVar34._18_2_ = uVar1;
        auVar34._20_2_ = uVar1;
        auVar34._22_2_ = uVar1;
        auVar34._24_2_ = uVar1;
        auVar34._26_2_ = uVar1;
        auVar34._28_2_ = uVar1;
        auVar34._30_2_ = uVar1;
        auVar93 = vpmullw_avx2(auVar77,auVar34);
        auVar89._8_8_ = 0;
        auVar89._0_8_ = *(ulong *)((long)in + lVar44 * 2);
        auVar100._8_8_ = 0;
        auVar100._0_8_ = *(ulong *)((long)in + lVar44 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar100,auVar89);
        auVar101._8_8_ = 0;
        auVar101._0_8_ = *(ulong *)((long)in + lVar44 * 2 + 0x240);
        auVar108._8_8_ = 0;
        auVar108._0_8_ = *(ulong *)((long)in + lVar44 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar108,auVar101);
        auVar95._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar95._16_16_ = ZEXT116(1) * auVar56;
        auVar4._16_8_ = uVar128;
        auVar4._0_16_ = auVar127;
        auVar4._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar95,auVar4);
        auVar137 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar4 = vpsrlw_avx2(auVar77,auVar126);
        auVar4 = vpsubusw_avx2(auVar36,auVar4);
        auVar77 = vpminsw_avx2(auVar4,auVar77);
        auVar4 = vpaddw_avx2(auVar77,auVar137);
        auVar109._8_8_ = 0;
        auVar109._0_8_ = *(ulong *)((long)in + lVar42);
        auVar116._8_8_ = 0;
        auVar116._0_8_ = *(ulong *)((long)in + lVar42 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar116,auVar109);
        auVar117._8_8_ = 0;
        auVar117._0_8_ = *(ulong *)((long)in + lVar42 + 0x240);
        auVar130._8_8_ = 0;
        auVar130._0_8_ = *(ulong *)((long)in + lVar42 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar130,auVar117);
        auVar98._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar98._16_16_ = ZEXT116(1) * auVar56;
        auVar112._16_8_ = uVar128;
        auVar112._0_16_ = auVar127;
        auVar112._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar98,auVar112);
        auVar105 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar112 = vpsrlw_avx2(auVar77,auVar126);
        auVar112 = vpsubusw_avx2(auVar36,auVar112);
        auVar77 = vpminsw_avx2(auVar112,auVar77);
        auVar77 = vpaddw_avx2(auVar105,auVar77);
        auVar77 = vpaddw_avx2(auVar105 ^ auVar77,auVar4 ^ auVar137);
        auVar32._2_2_ = uVar2;
        auVar32._0_2_ = uVar2;
        auVar32._4_2_ = uVar2;
        auVar32._6_2_ = uVar2;
        auVar32._8_2_ = uVar2;
        auVar32._10_2_ = uVar2;
        auVar32._12_2_ = uVar2;
        auVar32._14_2_ = uVar2;
        auVar32._16_2_ = uVar2;
        auVar32._18_2_ = uVar2;
        auVar32._20_2_ = uVar2;
        auVar32._22_2_ = uVar2;
        auVar32._24_2_ = uVar2;
        auVar32._26_2_ = uVar2;
        auVar32._28_2_ = uVar2;
        auVar32._30_2_ = uVar2;
        auVar77 = vpmullw_avx2(auVar77,auVar32);
        auVar4 = vpaddw_avx2(auVar77,auVar93);
        auVar77 = vpand_avx2(auVar62,auVar85);
        auVar137._16_8_ = uVar128;
        auVar137._0_16_ = auVar127;
        auVar137._24_8_ = uVar129;
        auVar112 = vpmaxsw_avx2(auVar137,auVar77);
        auVar77 = vpand_avx2(auVar62,auVar63);
        auVar93 = vpand_avx2(auVar62,auVar95);
        auVar77 = vpmaxsw_avx2(auVar93,auVar77);
        auVar137 = vpmaxsw_avx2(auVar112,auVar77);
        auVar105._16_8_ = uVar128;
        auVar105._0_16_ = auVar127;
        auVar105._24_8_ = uVar129;
        auVar77 = vpminsw_avx2(auVar105,auVar85);
        auVar93 = vpminsw_avx2(auVar63,auVar95);
        auVar105 = vpminsw_avx2(auVar77,auVar93);
        auVar126._8_8_ = 0;
        auVar126._0_8_ = *(ulong *)((long)in + lVar45 * 2);
        auVar69._8_8_ = 0;
        auVar69._0_8_ = *(ulong *)((long)in + lVar45 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar69,auVar126);
        auVar70._8_8_ = 0;
        auVar70._0_8_ = *(ulong *)((long)in + lVar45 * 2 + 0x240);
        auVar80._8_8_ = 0;
        auVar80._0_8_ = *(ulong *)((long)in + lVar45 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar80,auVar70);
        auVar64._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar64._16_16_ = ZEXT116(1) * auVar56;
        auVar104._16_8_ = uVar128;
        auVar104._0_16_ = auVar127;
        auVar104._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar64,auVar104);
        auVar104 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar93 = vpsrlw_avx2(auVar77,auVar55);
        auVar30._2_2_ = uVar54;
        auVar30._0_2_ = uVar54;
        auVar30._4_2_ = uVar54;
        auVar30._6_2_ = uVar54;
        auVar30._8_2_ = uVar54;
        auVar30._10_2_ = uVar54;
        auVar30._12_2_ = uVar54;
        auVar30._14_2_ = uVar54;
        auVar30._16_2_ = uVar54;
        auVar30._18_2_ = uVar54;
        auVar30._20_2_ = uVar54;
        auVar30._22_2_ = uVar54;
        auVar30._24_2_ = uVar54;
        auVar30._26_2_ = uVar54;
        auVar30._28_2_ = uVar54;
        auVar30._30_2_ = uVar54;
        auVar93 = vpsubusw_avx2(auVar30,auVar93);
        auVar77 = vpminsw_avx2(auVar77,auVar93);
        auVar93 = vpaddw_avx2(auVar77,auVar104);
        auVar71._8_8_ = 0;
        auVar71._0_8_ = *(ulong *)((long)in + lVar50);
        auVar81._8_8_ = 0;
        auVar81._0_8_ = *(ulong *)((long)in + lVar50 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar81,auVar71);
        auVar82._8_8_ = 0;
        auVar82._0_8_ = *(ulong *)((long)in + lVar50 + 0x240);
        auVar90._8_8_ = 0;
        auVar90._0_8_ = *(ulong *)((long)in + lVar50 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar90,auVar82);
        auVar144._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar144._16_16_ = ZEXT116(1) * auVar56;
        auVar122._16_8_ = uVar128;
        auVar122._0_16_ = auVar127;
        auVar122._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar144,auVar122);
        auVar122 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar112 = vpsrlw_avx2(auVar77,auVar55);
        auVar112 = vpsubusw_avx2(auVar30,auVar112);
        auVar77 = vpminsw_avx2(auVar77,auVar112);
        auVar77 = vpaddw_avx2(auVar77,auVar122);
        auVar93 = vpaddw_avx2(auVar77 ^ auVar122,auVar93 ^ auVar104);
        auVar72._8_8_ = 0;
        auVar72._0_8_ = *(ulong *)((long)in + lVar41 * 2);
        auVar83._8_8_ = 0;
        auVar83._0_8_ = *(ulong *)((long)in + lVar41 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar83,auVar72);
        auVar84._8_8_ = 0;
        auVar84._0_8_ = *(ulong *)((long)in + lVar41 * 2 + 0x240);
        auVar91._8_8_ = 0;
        auVar91._0_8_ = *(ulong *)((long)in + lVar41 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar91,auVar84);
        auVar86._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar86._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
        auVar124._16_8_ = uVar128;
        auVar124._0_16_ = auVar127;
        auVar124._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar86,auVar124);
        auVar122 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar112 = vpsrlw_avx2(auVar77,auVar55);
        auVar112 = vpsubusw_avx2(auVar30,auVar112);
        auVar77 = vpminsw_avx2(auVar77,auVar112);
        auVar112 = vpaddw_avx2(auVar77,auVar122);
        auVar92._8_8_ = 0;
        auVar92._0_8_ = *(ulong *)((long)in + lVar47);
        auVar110._8_8_ = 0;
        auVar110._0_8_ = *(ulong *)((long)in + lVar47 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar110,auVar92);
        auVar111._8_8_ = 0;
        auVar111._0_8_ = *(ulong *)((long)in + lVar47 + 0x240);
        auVar118._8_8_ = 0;
        auVar118._0_8_ = *(ulong *)((long)in + lVar47 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar118,auVar111);
        auVar96._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar96._16_16_ = ZEXT116(1) * auVar56;
        auVar20._16_8_ = uVar128;
        auVar20._0_16_ = auVar127;
        auVar20._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar96,auVar20);
        auVar124 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar104 = vpsrlw_avx2(auVar77,auVar55);
        auVar104 = vpsubusw_avx2(auVar30,auVar104);
        auVar77 = vpminsw_avx2(auVar104,auVar77);
        auVar77 = vpaddw_avx2(auVar124,auVar77);
        auVar77 = vpaddw_avx2(auVar112 ^ auVar122,auVar124 ^ auVar77);
        auVar77 = vpaddw_avx2(auVar93,auVar77);
        auVar28._8_2_ = 2;
        auVar28._0_8_ = 0x2000200020002;
        auVar28._10_2_ = 2;
        auVar28._12_2_ = 2;
        auVar28._14_2_ = 2;
        auVar28._16_2_ = 2;
        auVar28._18_2_ = 2;
        auVar28._20_2_ = 2;
        auVar28._22_2_ = 2;
        auVar28._24_2_ = 2;
        auVar28._26_2_ = 2;
        auVar28._28_2_ = 2;
        auVar28._30_2_ = 2;
        auVar77 = vpmullw_avx2(auVar77,auVar28);
        auVar4 = vpaddw_avx2(auVar4,auVar77);
        auVar59._8_8_ = 0;
        auVar59._0_8_ = *(ulong *)((long)in + lVar46 * 2);
        auVar73._8_8_ = 0;
        auVar73._0_8_ = *(ulong *)((long)in + lVar46 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar73,auVar59);
        auVar74._8_8_ = 0;
        auVar74._0_8_ = *(ulong *)((long)in + lVar46 * 2 + 0x240);
        auVar102._8_8_ = 0;
        auVar102._0_8_ = *(ulong *)((long)in + lVar46 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar102,auVar74);
        auVar107._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar107._16_16_ = ZEXT116(1) * auVar56;
        auVar21._16_8_ = uVar128;
        auVar21._0_16_ = auVar127;
        auVar21._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar107,auVar21);
        auVar104 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar93 = vpsrlw_avx2(auVar77,auVar55);
        auVar93 = vpsubusw_avx2(auVar30,auVar93);
        auVar77 = vpminsw_avx2(auVar93,auVar77);
        auVar93 = vpaddw_avx2(auVar77,auVar104);
        auVar75._8_8_ = 0;
        auVar75._0_8_ = *(ulong *)((long)in + lVar52);
        auVar119._8_8_ = 0;
        auVar119._0_8_ = *(ulong *)((long)in + lVar52 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar119,auVar75);
        auVar120._8_8_ = 0;
        auVar120._0_8_ = *(ulong *)((long)in + lVar52 + 0x240);
        auVar132._8_8_ = 0;
        auVar132._0_8_ = *(ulong *)((long)in + lVar52 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar132,auVar120);
        auVar125._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar125._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
        auVar22._16_8_ = uVar128;
        auVar22._0_16_ = auVar127;
        auVar22._24_8_ = uVar129;
        auVar77 = vpsubw_avx2(auVar125,auVar22);
        auVar122 = vpsraw_avx2(auVar77,0xf);
        auVar77 = vpabsw_avx2(auVar77);
        auVar112 = vpsrlw_avx2(auVar77,auVar55);
        auVar112 = vpsubusw_avx2(auVar30,auVar112);
        auVar77 = vpminsw_avx2(auVar112,auVar77);
        auVar77 = vpaddw_avx2(auVar122,auVar77);
        auVar93 = vpaddw_avx2(auVar122 ^ auVar77,auVar93 ^ auVar104);
        auVar60._8_8_ = 0;
        auVar60._0_8_ = *(ulong *)((long)in + lVar49 * 2);
        auVar133._8_8_ = 0;
        auVar133._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar133,auVar60);
        auVar134._8_8_ = 0;
        auVar134._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x240);
        auVar139._8_8_ = 0;
        auVar139._0_8_ = *(ulong *)((long)in + lVar49 * 2 + 0x360);
        auVar57 = vpunpcklqdq_avx(auVar139,auVar134);
        auVar65._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar65._16_16_ = ZEXT116(1) * auVar56;
        auVar23._16_8_ = uVar128;
        auVar23._0_16_ = auVar127;
        auVar23._24_8_ = uVar129;
        auVar104 = vpsubw_avx2(auVar65,auVar23);
        auVar77 = vpabsw_avx2(auVar104);
        auVar112 = vpsrlw_avx2(auVar77,auVar55);
        auVar124 = vpsraw_avx2(auVar104,0xf);
        auVar112 = vpsubusw_avx2(auVar30,auVar112);
        auVar77 = vpminsw_avx2(auVar77,auVar112);
        auVar112 = vpaddw_avx2(auVar124,auVar77);
        auVar135._8_8_ = 0;
        auVar135._0_8_ = *(ulong *)((long)in + lVar38);
        auVar140._8_8_ = 0;
        auVar140._0_8_ = *(ulong *)((long)in + lVar38 + 0x120);
        auVar56 = vpunpcklqdq_avx(auVar140,auVar135);
        auVar131._8_8_ = 0;
        auVar131._0_8_ = *(ulong *)((long)in + lVar38 + 0x360);
        auVar141._8_8_ = 0;
        auVar141._0_8_ = *(ulong *)((long)in + lVar38 + 0x240);
        auVar57 = vpunpcklqdq_avx(auVar131,auVar141);
        auVar136._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar57;
        auVar136._16_16_ = ZEXT116(1) * auVar56;
        auVar24._16_8_ = uVar128;
        auVar24._0_16_ = auVar127;
        auVar24._24_8_ = uVar129;
        auVar122 = vpsubw_avx2(auVar136,auVar24);
        auVar77 = vpabsw_avx2(auVar122);
        auVar104 = vpsrlw_avx2(auVar77,auVar55);
        auVar104 = vpsubusw_avx2(auVar30,auVar104);
        auVar77 = vpminsw_avx2(auVar77,auVar104);
        auVar104 = vpsraw_avx2(auVar122,0xf);
        auVar77 = vpaddw_avx2(auVar104,auVar77);
        auVar77 = vpaddw_avx2(auVar124 ^ auVar112,auVar104 ^ auVar77);
        auVar77 = vpaddw_avx2(auVar93,auVar77);
        auVar93 = vpand_avx2(auVar62,auVar98);
        auVar27._8_2_ = 1;
        auVar27._0_8_ = 0x1000100010001;
        auVar27._10_2_ = 1;
        auVar27._12_2_ = 1;
        auVar27._14_2_ = 1;
        auVar27._16_2_ = 1;
        auVar27._18_2_ = 1;
        auVar27._20_2_ = 1;
        auVar27._22_2_ = 1;
        auVar27._24_2_ = 1;
        auVar27._26_2_ = 1;
        auVar27._28_2_ = 1;
        auVar27._30_2_ = 1;
        auVar77 = vpmullw_avx2(auVar77,auVar27);
        auVar77 = vpaddw_avx2(auVar77,auVar4);
        auVar4 = vpand_avx2(auVar64,auVar62);
        auVar93 = vpmaxsw_avx2(auVar93,auVar4);
        auVar4 = vpand_avx2(auVar144,auVar62);
        auVar4 = vpmaxsw_avx2(auVar93,auVar4);
        auVar112 = vpmaxsw_avx2(auVar4,auVar137);
        auVar4 = vpand_avx2(auVar62,auVar86);
        auVar93 = vpand_avx2(auVar62,auVar96);
        auVar93 = vpmaxsw_avx2(auVar93,auVar4);
        auVar4 = vpand_avx2(auVar62,auVar107);
        auVar93 = vpmaxsw_avx2(auVar4,auVar93);
        auVar4 = vpand_avx2(auVar125,auVar62);
        auVar4 = vpmaxsw_avx2(auVar4,auVar93);
        auVar112 = vpmaxsw_avx2(auVar112,auVar4);
        auVar4 = vpand_avx2(auVar62,auVar65);
        auVar93 = vpand_avx2(auVar136,auVar62);
        auVar4 = vpmaxsw_avx2(auVar93,auVar4);
        auVar4 = vpmaxsw_avx2(auVar112,auVar4);
        auVar93 = vpminsw_avx2(auVar64,auVar98);
        auVar93 = vpminsw_avx2(auVar144,auVar93);
        auVar93 = vpminsw_avx2(auVar93,auVar105);
        auVar112 = vpminsw_avx2(auVar86,auVar96);
        auVar112 = vpminsw_avx2(auVar112,auVar107);
        auVar112 = vpminsw_avx2(auVar125,auVar112);
        auVar93 = vpminsw_avx2(auVar93,auVar112);
        auVar112 = vpminsw_avx2(auVar136,auVar65);
        auVar93 = vpminsw_avx2(auVar93,auVar112);
        auVar112 = vpsraw_avx2(auVar77,0xf);
        auVar37._8_2_ = 8;
        auVar37._0_8_ = 0x8000800080008;
        auVar37._10_2_ = 8;
        auVar37._12_2_ = 8;
        auVar37._14_2_ = 8;
        auVar37._16_2_ = 8;
        auVar37._18_2_ = 8;
        auVar37._20_2_ = 8;
        auVar37._22_2_ = 8;
        auVar37._24_2_ = 8;
        auVar37._26_2_ = 8;
        auVar37._28_2_ = 8;
        auVar37._30_2_ = 8;
        auVar77 = vpaddw_avx2(auVar77,auVar37);
        auVar77 = vpaddw_avx2(auVar77,auVar112);
        auVar77 = vpsraw_avx2(auVar77,4);
        auVar25._16_8_ = uVar128;
        auVar25._0_16_ = auVar127;
        auVar25._24_8_ = uVar129;
        auVar77 = vpaddw_avx2(auVar25,auVar77);
        auVar77 = vpmaxsw_avx2(auVar77,auVar93);
        auVar77 = vpminsw_avx2(auVar77,auVar4);
        uVar128 = vpextrq_avx(auVar77._16_16_,1);
        *(undefined8 *)dest = uVar128;
        *(long *)((long)dest + CONCAT26(sStack_194,(int6)dstride) * 2) = auVar77._16_8_;
        uVar128 = vpextrq_avx(auVar77._0_16_,1);
        *(undefined8 *)((long)dest + CONCAT26(sStack_194,(int6)dstride) * 4) = uVar128;
        *(long *)((long)dest + (long)dstride * 6) = auVar77._0_8_;
        uVar43 = uVar43 + 4;
        in = (uint16_t *)((long)in + 0x480);
        dest = (void *)((long)dest + (long)dstride * 8);
      } while (uVar43 < (uint)block_height);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_16_0)(void *dest, int dstride, const uint16_t *in,
                                 int pri_strength, int sec_strength, int dir,
                                 int pri_damping, int sec_damping,
                                 int coeff_shift, int block_width,
                                 int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  } else {
    filter_block_4x4(/*is_lowbd=*/0, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/1);
  }
}